

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::GetMainInertiasInMassReference
          (ChBeamSectionRayleighAdvancedGeneric *this,double *Jmyy,double *Jmzz,double *phi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  dVar7 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7;
  dVar4 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  dVar5 = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->Jzz;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5 * dVar4;
  auVar14 = vfnmadd213sd_fma(auVar14,auVar6,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->Jyy;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4 * dVar7;
  auVar2 = vfnmadd213sd_fma(auVar11,auVar8,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->Jyz;
  auVar1 = vfmsub213sd_fma(auVar6,auVar8,auVar3);
  dVar10 = auVar2._0_8_;
  dVar13 = auVar14._0_8_;
  dVar7 = (dVar10 - dVar13) * 0.5;
  dVar5 = auVar1._0_8_;
  dVar7 = dVar5 * dVar5 + dVar7 * dVar7;
  dVar4 = 0.0;
  if (dVar7 <= 0.0) {
    dVar7 = (dVar10 + dVar13) * 0.5;
    dVar5 = dVar7;
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar7;
    auVar1 = vsqrtsd_avx(auVar9,auVar9);
    dVar7 = auVar1._0_8_;
    dVar4 = atan2(dVar5 / dVar7,(dVar13 - dVar10) / (dVar7 + dVar7));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar7;
    dVar4 = dVar4 * -0.5;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar13 + dVar10;
    auVar1 = vfmsub213sd_fma(ZEXT816(0x3fe0000000000000),auVar12,auVar15);
    dVar7 = auVar1._0_8_;
    auVar1 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar12,auVar15);
    dVar5 = auVar1._0_8_;
  }
  *phi = dVar4;
  *Jmyy = dVar7;
  *Jmzz = dVar5;
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::GetMainInertiasInMassReference(double& Jmyy, double& Jmzz, double& phi) {
		// remove inertia transport
		double Tyy_rot  =  this->Jyy - this->mu * this->Mz * this->Mz;
		double Tzz_rot  =  this->Jzz - this->mu * this->My * this->My;
		double Tyz_rot  = -this->Jyz + this->mu * this->Mz * this->My;
		// tensor de-rotation up to principal axes
		double argum = pow((Tyy_rot - Tzz_rot) * 0.5, 2) + pow(Tyz_rot, 2);
		if (argum <= 0) {
			phi = 0;
			Jmyy = 0.5 * (Tzz_rot + Tyy_rot);
			Jmzz = 0.5 * (Tzz_rot + Tyy_rot);
			return;
		}
		double discr = sqrt( pow((Tyy_rot - Tzz_rot)*0.5,2) + pow(Tyz_rot, 2) );
		phi = - 0.5* atan2(Tyz_rot / discr, (Tzz_rot - Tyy_rot) / (2. * discr));
		Jmyy = 0.5 * (Tzz_rot + Tyy_rot) - discr;
		Jmzz = 0.5 * (Tzz_rot + Tyy_rot) + discr;
	}